

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::calcSelfCorrection(Electrostatic *this,SelfData *sdat)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  reference pvVar4;
  double *pdVar5;
  int *in_RSI;
  long in_RDI;
  double dVar6;
  double dVar7;
  RealType trQQ;
  RealType trQ;
  RealType DdD;
  RealType preVal;
  RealType fqf;
  RealType selfPot;
  RealType C_a;
  bool i_is_Fluctuating;
  bool i_is_Quadrupole;
  bool i_is_Dipole;
  bool i_is_Charge;
  ElectrostaticAtomData data;
  Electrostatic *in_stack_000007c0;
  ElectrostaticAtomData *in_stack_fffffffffffffe68;
  int __y;
  ElectrostaticAtomData *in_stack_fffffffffffffe70;
  SquareMatrix3<double> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int iVar8;
  RealType *in_stack_fffffffffffffed0;
  RealType *in_stack_fffffffffffffed8;
  RealType in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  FluctuatingChargeForces *in_stack_fffffffffffffef0;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  double local_98;
  SquareMatrix3<double> local_58;
  int *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(in_stack_000007c0);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)*local_10);
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
              *)(in_RDI + 200),(long)*pvVar4);
  ElectrostaticAtomData::ElectrostaticAtomData(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  __y = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  bVar1 = local_a0 & 1;
  bVar2 = local_9f & 1;
  bVar3 = local_9d & 1;
  local_b0 = local_98;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_d0 = 0.0;
  if (bVar2 != 0) {
    local_d0 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x42b965);
  }
  if (bVar3 != 0) {
    local_b0 = local_98 + *(double *)(local_10 + 0x1c);
    FluctuatingChargeForces::getSelfInteraction
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  iVar8 = *(int *)(in_RDI + 0x254);
  if (2 < iVar8 - 2U) {
    if (iVar8 == 5) {
      if (bVar1 != 0) {
        local_b8 = 0.0 - (*(double *)(in_RDI + 0x148) * *(double *)(in_RDI + 0x2d0) * local_b0 *
                          local_b0 * 0.5) / *(double *)(in_RDI + 0x140);
      }
      if (bVar2 != 0) {
        local_b8 = -(*(double *)(in_RDI + 0x158) * *(double *)(in_RDI + 0x2d0)) * local_d0 +
                   local_b8;
      }
      goto LAB_0042bde1;
    }
    if (iVar8 != 6) goto LAB_0042bde1;
  }
  if (bVar1 != 0) {
    dVar6 = *(double *)(in_RDI + 0x148);
    dVar7 = *(double *)(in_RDI + 0x2d8);
    in_stack_fffffffffffffea0 =
         (SquareMatrix3<double> *)std::pow<double,int>((double)in_stack_fffffffffffffe70,__y);
    local_b8 = dVar7 * dVar6 * (double)in_stack_fffffffffffffea0 + 0.0;
    if (bVar3 != 0) {
      local_c0 = -(*(double *)(in_RDI + 0x2d8) * *(double *)(in_RDI + 0x148) * 2.0) *
                 (local_b0 + *(double *)(local_10 + 2)) + 0.0;
    }
  }
  if (bVar2 != 0) {
    local_b8 = *(double *)(in_RDI + 0x2e0) * *(double *)(in_RDI + 0x158) * local_d0 + local_b8;
  }
  if ((local_9e & 1) != 0) {
    dVar6 = SquareMatrix3<double>::trace(&local_58);
    OpenMD::operator*((SquareMatrix3<double> *)CONCAT44(iVar8,in_stack_fffffffffffffea8),
                      in_stack_fffffffffffffea0);
    dVar7 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)&stack0xfffffffffffffec8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x42bca2);
    local_b8 = *(double *)(in_RDI + 0x2e8) * *(double *)(in_RDI + 0x170) *
               (dVar7 + dVar7 + dVar6 * dVar6) + local_b8;
    if ((bVar1 != 0) &&
       (local_b8 = -(*(double *)(in_RDI + 0x2e0) * *(double *)(in_RDI + 0x160) * 2.0 * local_b0) *
                   dVar6 + local_b8, bVar3 != 0)) {
      local_c0 = *(double *)(in_RDI + 0x2e0) * *(double *)(in_RDI + 0x160) * 2.0 * dVar6 + local_c0;
    }
  }
LAB_0042bde1:
  pdVar5 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 4),2);
  *pdVar5 = local_b8 + *pdVar5;
  if ((*(byte *)(local_10 + 0x20) & 1) != 0) {
    dVar6 = local_b8;
    pdVar5 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x22),2);
    *pdVar5 = dVar6 + *pdVar5;
  }
  if ((*(byte *)(local_10 + 0x12) & 1) != 0) {
    *(double *)(local_10 + 0x14) = local_b8 + *(double *)(local_10 + 0x14);
  }
  if (bVar3 != 0) {
    *(double *)(local_10 + 0x1e) = local_c0 + *(double *)(local_10 + 0x1e);
  }
  ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x42becc);
  return;
}

Assistant:

void Electrostatic::calcSelfCorrection(SelfData& sdat) {
    if (!initialized_) initialize();

    ElectrostaticAtomData data = ElectrostaticMap[Etids[sdat.atid]];

    // logicals
    bool i_is_Charge      = data.is_Charge;
    bool i_is_Dipole      = data.is_Dipole;
    bool i_is_Quadrupole  = data.is_Quadrupole;
    bool i_is_Fluctuating = data.is_Fluctuating;
    RealType C_a          = data.fixedCharge;
    RealType selfPot(0.0), fqf(0.0), preVal, DdD(0.0), trQ, trQQ;

    if (i_is_Dipole) { DdD = data.dipole.lengthSquare(); }

    if (i_is_Fluctuating) {
      // We're now doing all of the self pieces for fluctuating charges in
      // explicit self interactions.
      C_a += sdat.flucQ;
      flucQ_->getSelfInteraction(sdat.atid, sdat.flucQ, selfPot, fqf);
    }

    switch (summationMethod_) {
    case esm_REACTION_FIELD:

      if (i_is_Charge) {
        // Self potential [see Wang and Hermans, "Reaction Field
        // Molecular Dynamics Simulation with Friedman’s Image Charge
        // Method," J. Phys. Chem. 99, 12001-12007 (1995).]
        preVal = pre11_ * preRF_ * C_a * C_a;
        selfPot -= 0.5 * preVal / cutoffRadius_;
        // if (i_is_Fluctuating) {
        //  fqf += pre11_ * preRF_ * C_a / cutoffRadius_;
        //}
      }

      if (i_is_Dipole) { selfPot -= pre22_ * preRF_ * DdD; }

      break;

    case esm_SHIFTED_FORCE:
    case esm_SHIFTED_POTENTIAL:
    case esm_TAYLOR_SHIFTED:
    case esm_EWALD_FULL:
      if (i_is_Charge) {
        selfPot += selfMult1_ * pre11_ * pow(C_a + sdat.skippedCharge, 2);
        if (i_is_Fluctuating) {
          fqf -= selfMult1_ * pre11_ * 2.0 * (C_a + sdat.skippedCharge);
        }
      }
      if (i_is_Dipole) selfPot += selfMult2_ * pre22_ * DdD;
      if (i_is_Quadrupole) {
        trQ  = data.quadrupole.trace();
        trQQ = (data.quadrupole * data.quadrupole).trace();
        selfPot += selfMult4_ * pre44_ * (2.0 * trQQ + trQ * trQ);
        if (i_is_Charge) {
          selfPot -= selfMult2_ * pre14_ * 2.0 * C_a * trQ;
          if (i_is_Fluctuating) { fqf += selfMult2_ * pre14_ * 2.0 * trQ; }
        }
      }
      break;
    default:
      break;
    }

    sdat.selfPot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.isSelected) sdat.selePot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.doParticlePot) { sdat.particlePot += selfPot; }

    if (i_is_Fluctuating) sdat.flucQfrc += fqf;
  }